

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LUX_Run03.hh
# Opt level: O0

double __thiscall
DetectorExample_LUX_RUN03::FitS2
          (DetectorExample_LUX_RUN03 *this,double xPos_mm,double yPos_mm,LCE map)

{
  uint uVar1;
  ostream *this_00;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double finalCorr;
  double radius;
  LCE map_local;
  double yPos_mm_local;
  double xPos_mm_local;
  DetectorExample_LUX_RUN03 *this_local;
  
  dVar2 = pow(xPos_mm,2.0);
  dVar3 = pow(yPos_mm,2.0);
  dVar2 = sqrt(dVar2 + dVar3);
  dVar3 = pow(dVar2,1.0);
  dVar4 = pow(dVar2,2.0);
  dVar5 = pow(dVar2,3.0);
  dVar6 = pow(dVar2,4.0);
  dVar7 = pow(dVar2,5.0);
  dVar8 = pow(dVar2,6.0);
  dVar9 = pow(dVar2,7.0);
  this_local = (DetectorExample_LUX_RUN03 *)
               ((dVar9 * -7.3989e-12 +
                dVar8 * 5.6513e-09 +
                dVar7 * -1.6953e-06 +
                dVar6 * 0.0002474 + dVar5 * -0.017144 + dVar4 * 0.38126 + dVar3 * 6.2275 + 9156.3) /
               9156.3);
  if (((((double)this_local < 0.5) || (1.5 < (double)this_local)) ||
      (uVar1 = std::isnan((double)this_local), (uVar1 & 1) != 0)) &&
     (dVar2 < (this->super_VDetector).radmax)) {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "ERR: S2 corrections exceed a 50% difference. Are you sure you didn\'t forget to change LUX numbers for your own detector??"
                             );
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local = (DetectorExample_LUX_RUN03 *)0x3ff0000000000000;
  }
  return (double)this_local;
}

Assistant:

double FitS2(double xPos_mm, double yPos_mm, LCE map) override {
    double radius = sqrt(pow(xPos_mm, 2.) + pow(yPos_mm, 2.));

    double finalCorr =  // unitless, 1.000 at detector center
        9156.3 + 6.22750 * pow(radius, 1.) + 0.38126 * pow(radius, 2.) -
        0.017144 * pow(radius, 3.) + 0.0002474 * pow(radius, 4.) -
        1.6953e-6 * pow(radius, 5.) + 5.6513e-9 * pow(radius, 6.) -
        7.3989e-12 * pow(radius, 7.);
    finalCorr /= 9156.3;
    if ((finalCorr < 0.5 || finalCorr > 1.5 || std::isnan(finalCorr)) &&
        radius < radmax) {
      cerr << "ERR: S2 corrections exceed a 50% difference. Are you sure you "
              "didn't forget to change LUX numbers for your own detector??"
           << endl;
      return 1.;
    } else
      return finalCorr;
  }